

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O1

void Curl_infof(Curl_easy *data,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buffer [2050];
  __va_list_tag local_8e8;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  char local_818 [2056];
  
  if (in_AL != '\0') {
    local_898 = in_XMM0_Qa;
    local_888 = in_XMM1_Qa;
    local_878 = in_XMM2_Qa;
    local_868 = in_XMM3_Qa;
    local_858 = in_XMM4_Qa;
    local_848 = in_XMM5_Qa;
    local_838 = in_XMM6_Qa;
    local_828 = in_XMM7_Qa;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
    local_8e8.gp_offset = 0x10;
    local_8e8.fp_offset = 0x30;
    local_8e8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_8e8.reg_save_area = local_8c8;
    local_8b8 = in_RDX;
    local_8b0 = in_RCX;
    local_8a8 = in_R8;
    local_8a0 = in_R9;
    iVar1 = curl_mvsnprintf(local_818,0x800,fmt,&local_8e8);
    (local_818 + iVar1)[0] = '\n';
    (local_818 + iVar1)[1] = '\0';
    Curl_debug(data,CURLINFO_TEXT,local_818,(long)iVar1 + 1);
  }
  return;
}

Assistant:

void Curl_infof(struct Curl_easy *data, const char *fmt, ...)
{
  DEBUGASSERT(!strchr(fmt, '\n'));
  if(data && data->set.verbose) {
    va_list ap;
    int len;
    char buffer[MAXINFO + 2];
    va_start(ap, fmt);
    len = mvsnprintf(buffer, MAXINFO, fmt, ap);
    va_end(ap);
    buffer[len++] = '\n';
    buffer[len] = '\0';
    Curl_debug(data, CURLINFO_TEXT, buffer, len);
  }
}